

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioContextManager.cpp
# Opt level: O3

void __thiscall gmlc::networking::AsioContextManager::~AsioContextManager(AsioContextManager *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Atomic_word *p_Var2;
  size_t *psVar3;
  bool bVar4;
  work *pwVar5;
  impl_type *piVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  io_context *__ptr;
  pointer pcVar8;
  byte bVar9;
  int iVar10;
  
  this->_vptr_AsioContextManager = (_func_int **)&PTR__AsioContextManager_005692f8;
  if ((this->running)._M_i == stopped) {
    if ((this->loopRet).super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::__basic_future<void>::_M_get_result(&(this->loopRet).super___basic_future<void>);
    }
  }
  else {
    iVar10 = pthread_mutex_lock((pthread_mutex_t *)&this->runningLoopLock);
    if (iVar10 != 0) {
      std::__throw_system_error(iVar10);
    }
    pwVar5 = (this->nullwork)._M_t.
             super___uniq_ptr_impl<asio::io_context::work,_std::default_delete<asio::io_context::work>_>
             ._M_t.
             super__Tuple_impl<0UL,_asio::io_context::work_*,_std::default_delete<asio::io_context::work>_>
             .super__Head_base<0UL,_asio::io_context::work_*,_false>._M_head_impl;
    (this->nullwork)._M_t.
    super___uniq_ptr_impl<asio::io_context::work,_std::default_delete<asio::io_context::work>_>._M_t
    .super__Tuple_impl<0UL,_asio::io_context::work_*,_std::default_delete<asio::io_context::work>_>.
    super__Head_base<0UL,_asio::io_context::work_*,_false>._M_head_impl = (work *)0x0;
    if (pwVar5 != (work *)0x0) {
      std::default_delete<asio::io_context::work>::operator()
                ((default_delete<asio::io_context::work> *)&this->nullwork,pwVar5);
    }
    piVar6 = ((this->ictx)._M_t.
              super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
              super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
              super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl)->impl_;
    bVar4 = (piVar6->mutex_).enabled_;
    bVar9 = bVar4;
    if (bVar4 == true) {
      pthread_mutex_lock((pthread_mutex_t *)&(piVar6->mutex_).mutex_);
      bVar9 = (piVar6->mutex_).enabled_;
    }
    piVar6->stopped_ = true;
    if ((bVar9 & 1) != 0) {
      psVar3 = &(piVar6->wakeup_event_).event_.state_;
      *(byte *)psVar3 = (byte)*psVar3 | 1;
      pthread_cond_broadcast((pthread_cond_t *)&(piVar6->wakeup_event_).event_);
    }
    if ((piVar6->task_interrupted_ == false) && (piVar6->task_ != (scheduler_task *)0x0)) {
      piVar6->task_interrupted_ = true;
      (*piVar6->task_->_vptr_scheduler_task[1])();
    }
    if (bVar4 != false) {
      pthread_mutex_unlock((pthread_mutex_t *)&(piVar6->mutex_).mutex_);
    }
    std::__basic_future<void>::_M_get_result(&(this->loopRet).super___basic_future<void>);
    pthread_mutex_unlock((pthread_mutex_t *)&this->runningLoopLock);
  }
  if (this->leakOnDelete == true) {
    (this->ictx)._M_t.
    super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
    super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
    super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl = (io_context *)0x0;
  }
  p_Var7 = (this->loopRet).super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
  }
  pwVar5 = (this->nullwork)._M_t.
           super___uniq_ptr_impl<asio::io_context::work,_std::default_delete<asio::io_context::work>_>
           ._M_t.
           super__Tuple_impl<0UL,_asio::io_context::work_*,_std::default_delete<asio::io_context::work>_>
           .super__Head_base<0UL,_asio::io_context::work_*,_false>._M_head_impl;
  if (pwVar5 != (work *)0x0) {
    std::default_delete<asio::io_context::work>::operator()
              ((default_delete<asio::io_context::work> *)&this->nullwork,pwVar5);
  }
  (this->nullwork)._M_t.
  super___uniq_ptr_impl<asio::io_context::work,_std::default_delete<asio::io_context::work>_>._M_t.
  super__Tuple_impl<0UL,_asio::io_context::work_*,_std::default_delete<asio::io_context::work>_>.
  super__Head_base<0UL,_asio::io_context::work_*,_false>._M_head_impl = (work *)0x0;
  __ptr = (this->ictx)._M_t.
          super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
          super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
          super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl;
  if (__ptr != (io_context *)0x0) {
    std::default_delete<asio::io_context>::operator()
              ((default_delete<asio::io_context> *)&this->ictx,__ptr);
  }
  (this->ictx)._M_t.super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>.
  _M_t.super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
  super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl = (io_context *)0x0;
  pcVar8 = (this->name)._M_dataplus._M_p;
  paVar1 = &(this->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar8 != paVar1) {
    operator_delete(pcVar8,paVar1->_M_allocated_capacity + 1);
  }
  p_Var7 = (this->super_enable_shared_from_this<gmlc::networking::AsioContextManager>)._M_weak_this.
           super___weak_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2 = &p_Var7->_M_weak_count;
      iVar10 = *p_Var2;
      *p_Var2 = *p_Var2 + -1;
      UNLOCK();
    }
    else {
      iVar10 = p_Var7->_M_weak_count;
      p_Var7->_M_weak_count = iVar10 + -1;
    }
    if (iVar10 == 1) {
      (*p_Var7->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

AsioContextManager::~AsioContextManager()
{
    //  std::cout << "deleting context manager\n";

    if (isRunning()) {
        try {
            std::lock_guard<std::mutex> nullLock(runningLoopLock);
            nullwork.reset();
            ictx->stop();
            loopRet.get();
        }
        catch (...) {
        }
    } else if (loopRet.valid()) {
        loopRet.get();
    }
    if (leakOnDelete) {
        // yes I am purposefully leaking this PHILIP TOP
        // this capability is needed for some operations on particular OS's with
        // the shared library operations that will crash if this is closed
        // before the library closes which really only happens at program
        // termination
        auto val = ictx.release();
        (void)(val);
    }
}